

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceDirWrapper.cpp
# Opt level: O2

bool __thiscall ResourceDirWrapper::wrap(ResourceDirWrapper *this)

{
  WORD WVar1;
  int iVar2;
  IMAGE_RESOURCE_DIRECTORY *pIVar3;
  ResourceEntryWrapper *this_00;
  undefined4 extraout_var;
  ulong uVar4;
  size_t topEntryId;
  size_t entryNumber;
  ulong uVar5;
  ResourceEntryWrapper *local_38;
  
  (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
    super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x2c])();
  if ((this->topEntryID == -1) && (this->album != (ResourcesAlbum *)0x0)) {
    ResourcesAlbum::clear(this->album);
  }
  pIVar3 = resourceDir(this);
  if (pIVar3 != (IMAGE_RESOURCE_DIRECTORY *)0x0) {
    uVar4 = (ulong)pIVar3->NumberOfIdEntries + (ulong)pIVar3->NumberOfNamedEntries;
    uVar5 = 0x32;
    if (uVar4 < 0x32) {
      uVar5 = uVar4;
    }
    for (entryNumber = 0; uVar5 != entryNumber; entryNumber = entryNumber + 1) {
      topEntryId = this->topEntryID;
      if (this->topEntryID == 0xffffffffffffffff) {
        topEntryId = entryNumber;
      }
      this_00 = (ResourceEntryWrapper *)operator_new(0x70);
      ResourceEntryWrapper::ResourceEntryWrapper
                (this_00,(this->super_DataDirEntryWrapper).super_PENodeWrapper.m_PE,this,entryNumber
                 ,topEntryId,this->album);
      iVar2 = (*(this_00->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
                super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xc])(this_00);
      if (CONCAT44(extraout_var,iVar2) == 0) {
        (*(this_00->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
          super_AbstractByteBuffer._vptr_AbstractByteBuffer[1])(this_00);
        break;
      }
      if ((this->topEntryID == -1) && (this->album != (ResourcesAlbum *)0x0)) {
        WVar1 = ResourceEntryWrapper::getID(this_00);
        ResourcesAlbum::mapIdToLeafType(this->album,entryNumber,(uint)WVar1);
      }
      local_38 = this_00;
      std::vector<ExeNodeWrapper*,std::allocator<ExeNodeWrapper*>>::emplace_back<ExeNodeWrapper*>
                ((vector<ExeNodeWrapper*,std::allocator<ExeNodeWrapper*>> *)
                 &(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.entries
                 ,(ExeNodeWrapper **)&local_38);
    }
  }
  return pIVar3 != (IMAGE_RESOURCE_DIRECTORY *)0x0;
}

Assistant:

bool ResourceDirWrapper::wrap()
{
    clear();
    if (this->topEntryID == TOP_ENTRY_ROOT && this->album != NULL) {
        this->album->clear();
    }
    IMAGE_RESOURCE_DIRECTORY* dir = resourceDir();
    if (dir == NULL) return false;
    size_t namesNum = dir->NumberOfNamedEntries;
    size_t idsNum = dir->NumberOfIdEntries;

    size_t totalEntries = namesNum + idsNum;
    for (size_t i = 0; i < totalEntries && i < MAX_ENTRIES; i++ ) {

        long topDirId = (this->topEntryID != TOP_ENTRY_ROOT) ? this->topEntryID : long(i) ;

        //ResourceEntryWrapper(PEFile *pe, ResourceDirWrapper *parentDir, size_t entryNumber, long topEntryId, ResourcesAlbum *resAlbum)
        ResourceEntryWrapper* entry = new ResourceEntryWrapper(this->m_PE, this, i, topDirId, this->album);

        if (entry->getPtr() == NULL) {
            delete entry;
            break;
        }
        if (this->topEntryID == TOP_ENTRY_ROOT && this->album != NULL) {
            pe::resource_type typeId = static_cast<pe::resource_type>(entry->getID());
            this->album->mapIdToLeafType(i, typeId);
        }
        //this->parsedSize += val;
        this->entries.push_back(entry);
    }
    //printf("Entries: %d\n", getEntriesCount());
    return true;
}